

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaResub2.c
# Opt level: O2

int Gia_ManVerifyTwoTruths(Gia_Man_t *p1,Gia_Man_t *p2)

{
  bool bVar1;
  int iVar2;
  Gia_Obj_t *pGVar3;
  Gia_Obj_t *pGVar4;
  word wVar5;
  word wVar6;
  uint v;
  
  iVar2 = p1->vCos->nSize;
  if (iVar2 == p2->vCos->nSize) {
    bVar1 = false;
    for (v = 0; (int)v < iVar2; v = v + 1) {
      pGVar3 = Gia_ManCo(p1,v);
      pGVar4 = Gia_ManCo(p2,v);
      wVar5 = Gia_LutComputeTruth66_rec(p1,pGVar3 + -(*(ulong *)pGVar3 & 0x1fffffff));
      wVar6 = Gia_LutComputeTruth66_rec(p2,pGVar4 + -(*(ulong *)pGVar4 & 0x1fffffff));
      if (((*(long *)pGVar3 << 0x22) >> 0x3f ^ wVar5) != ((*(long *)pGVar4 << 0x22) >> 0x3f ^ wVar6)
         ) {
        printf("Verification failed for output %d (out of %d).\n",(ulong)v,
               (ulong)(uint)p1->vCos->nSize);
        bVar1 = true;
      }
      iVar2 = p1->vCos->nSize;
    }
    return (uint)!bVar1;
  }
  __assert_fail("Gia_ManCoNum(p1) == Gia_ManCoNum(p2)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaResub2.c"
                ,0x507,"int Gia_ManVerifyTwoTruths(Gia_Man_t *, Gia_Man_t *)");
}

Assistant:

int Gia_ManVerifyTwoTruths( Gia_Man_t * p1, Gia_Man_t * p2 )
{
    int i, fFailed = 0;
    assert( Gia_ManCoNum(p1) == Gia_ManCoNum(p2) );
    for ( i = 0; i < Gia_ManCoNum(p1); i++ )
    {
        Gia_Obj_t * pPo1 = Gia_ManCo(p1, i);
        Gia_Obj_t * pPo2 = Gia_ManCo(p2, i);
        word word1 = Gia_LutComputeTruth66_rec( p1, Gia_ObjFanin0(pPo1) );
        word word2 = Gia_LutComputeTruth66_rec( p2, Gia_ObjFanin0(pPo2) );
        if ( Gia_ObjFaninC0(pPo1) )
            word1 = ~word1;
        if ( Gia_ObjFaninC0(pPo2) )
            word2 = ~word2;
        if ( word1 != word2 )
        {
            //Dau_DsdPrintFromTruth( &word1, 6 );
            //Dau_DsdPrintFromTruth( &word2, 6 );
            printf( "Verification failed for output %d (out of %d).\n", i, Gia_ManCoNum(p1) );
            fFailed = 1;
        }
    }
//    if ( !fFailed )
//        printf( "Verification succeeded for %d outputs.\n", Gia_ManCoNum(p1) );
    return !fFailed;
}